

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O0

Sle_Man_t * Sle_ManAlloc(Gia_Man_t *pGia,int nLevels,int fVerbose)

{
  int iVar1;
  Sle_Man_t *pSVar2;
  Vec_Bit_t *pVVar3;
  Vec_Int_t *pVVar4;
  Vec_Wec_t *pVVar5;
  Sle_Man_t *p;
  int fVerbose_local;
  int nLevels_local;
  Gia_Man_t *pGia_local;
  
  pSVar2 = (Sle_Man_t *)calloc(1,0xa0);
  pSVar2->pGia = pGia;
  pSVar2->nLevels = nLevels;
  pSVar2->fVerbose = fVerbose;
  pVVar3 = Sle_ManInternalNodeMask(pGia);
  pSVar2->vMask = pVVar3;
  pVVar4 = Sle_ManComputeCuts(pGia,4,fVerbose);
  pSVar2->vCuts = pVVar4;
  pVVar5 = Sle_ManCollectCutFanins(pGia,pSVar2->vCuts,pSVar2->vMask);
  pSVar2->vCutFanins = pVVar5;
  iVar1 = Gia_ManObjNum(pGia);
  pVVar5 = Vec_WecStart(iVar1);
  pSVar2->vFanoutEdges = pVVar5;
  pVVar5 = Vec_WecAlloc(100);
  pSVar2->vEdgeCuts = pVVar5;
  iVar1 = Gia_ManObjNum(pGia);
  pVVar4 = Vec_IntStartFull(iVar1);
  pSVar2->vObjMap = pVVar4;
  iVar1 = Gia_ManObjNum(pGia);
  pVVar4 = Vec_IntStartFull(iVar1);
  pSVar2->vCutFirst = pVVar4;
  iVar1 = Gia_ManObjNum(pGia);
  pVVar4 = Vec_IntStartFull(iVar1);
  pSVar2->vEdgeFirst = pVVar4;
  iVar1 = Gia_ManObjNum(pGia);
  pVVar4 = Vec_IntStartFull(iVar1);
  pSVar2->vDelayFirst = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vPolars = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pSVar2->vLits = pVVar4;
  iVar1 = Sle_ManComputeDelay(pGia,pSVar2->vCuts);
  pSVar2->nLevels = iVar1;
  return pSVar2;
}

Assistant:

Sle_Man_t * Sle_ManAlloc( Gia_Man_t * pGia, int nLevels, int fVerbose )
{
    Sle_Man_t * p   = ABC_CALLOC( Sle_Man_t, 1 );
    p->pGia         = pGia;
    p->nLevels      = nLevels;
    p->fVerbose     = fVerbose;
    p->vMask        = Sle_ManInternalNodeMask( pGia );
    p->vCuts        = Sle_ManComputeCuts( pGia, 4, fVerbose );
    p->vCutFanins   = Sle_ManCollectCutFanins( pGia, p->vCuts, p->vMask );
    p->vFanoutEdges = Vec_WecStart( Gia_ManObjNum(pGia) );
    p->vEdgeCuts    = Vec_WecAlloc( 100 );
    p->vObjMap      = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vCutFirst    = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vEdgeFirst   = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vDelayFirst  = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vPolars      = Vec_IntAlloc( 100 );
    p->vLits        = Vec_IntAlloc( 100 );
    p->nLevels      = Sle_ManComputeDelay( pGia, p->vCuts );
    return p;
}